

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::DataTypeSyntax::isKind(SyntaxKind kind)

{
  if ((int)kind < 0x141) {
    if ((kind - IntType < 0x1f) && ((0x40200005U >> (kind - IntType & 0x1f) & 1) != 0)) {
      return true;
    }
    if ((kind < CaseEqualityExpression) && ((0x640000000000000U >> ((ulong)kind & 0x3f) & 1) != 0))
    {
      return true;
    }
    if ((kind - EnumType < 0x3f) &&
       ((0x4000000000000081U >> ((ulong)(kind - EnumType) & 0x3f) & 1) != 0)) {
      return true;
    }
  }
  else if ((((kind - PropertyType < 0x40) &&
            ((0xa00001a00001c001U >> ((ulong)(kind - PropertyType) & 0x3f) & 1) != 0)) ||
           ((kind - TimeType < 0x38 &&
            ((0xa0840000001001U >> ((ulong)(kind - TimeType) & 0x3f) & 1) != 0)))) ||
          (kind == NamedType)) {
    return true;
  }
  return false;
}

Assistant:

bool DataTypeSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::BitType:
        case SyntaxKind::ByteType:
        case SyntaxKind::CHandleType:
        case SyntaxKind::EnumType:
        case SyntaxKind::EventType:
        case SyntaxKind::ImplicitType:
        case SyntaxKind::IntType:
        case SyntaxKind::IntegerType:
        case SyntaxKind::LogicType:
        case SyntaxKind::LongIntType:
        case SyntaxKind::NamedType:
        case SyntaxKind::PropertyType:
        case SyntaxKind::RealTimeType:
        case SyntaxKind::RealType:
        case SyntaxKind::RegType:
        case SyntaxKind::SequenceType:
        case SyntaxKind::ShortIntType:
        case SyntaxKind::ShortRealType:
        case SyntaxKind::StringType:
        case SyntaxKind::StructType:
        case SyntaxKind::TimeType:
        case SyntaxKind::TypeReference:
        case SyntaxKind::UnionType:
        case SyntaxKind::Untyped:
        case SyntaxKind::VirtualInterfaceType:
        case SyntaxKind::VoidType:
            return true;
        default:
            return false;
    }
}